

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O2

RunResult __thiscall
wabt::interp::Thread::DoSimdShift<unsigned_int,unsigned_int>
          (Thread *this,BinopFunc<unsigned_int,_unsigned_int> *f)

{
  uint uVar1;
  uint uVar2;
  u8 i;
  long lVar3;
  Simd<unsigned_int,_(unsigned_char)__x04_> SVar4;
  SR result;
  Simd<unsigned_int,_(unsigned_char)__x04_> lhs;
  Simd<unsigned_int,_(unsigned_char)__x04_> local_40;
  uint local_30 [4];
  
  uVar1 = Pop<unsigned_int>(this);
  SVar4 = Pop<wabt::interp::Simd<unsigned_int,(unsigned_char)4>>(this);
  local_30[0] = SVar4.v[0];
  local_30[1] = SVar4.v[1];
  local_30[2] = SVar4.v[2];
  local_30[3] = SVar4.v[3];
  for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
    uVar2 = (*f)(local_30[lVar3],uVar1);
    local_40.v[lVar3] = uVar2;
  }
  Push<wabt::interp::Simd<unsigned_int,(unsigned_char)4>>(this,local_40);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdShift(BinopFunc<R, T> f) {
  using ST = typename Simd128<T>::Type;
  using SR = typename Simd128<R>::Type;
  static_assert(ST::lanes == SR::lanes, "SIMD lanes don't match");
  auto amount = Pop<u32>();
  auto lhs = Pop<ST>();
  SR result;
  for (u8 i = 0; i < SR::lanes; ++i) {
    result[i] = f(lhs[i], amount);
  }
  Push(result);
  return RunResult::Ok;
}